

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  char *pcVar1;
  FilePath *in_RDI;
  char *result;
  char cwd [4097];
  string *pathname;
  FilePath *this;
  allocator<char> *in_stack_ffffffffffffefb0;
  char *in_stack_ffffffffffffefb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefc0;
  FilePath local_1018 [128];
  
  memset(local_1018,0,0x1001);
  pcVar1 = getcwd((char *)local_1018,0x1001);
  if (pcVar1 == (char *)0x0) {
    this = (FilePath *)0x16e596;
  }
  else {
    this = local_1018;
  }
  pathname = (string *)&stack0xffffffffffffefbf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
  FilePath(this,pathname);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffefc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffefbf);
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE || GTEST_OS_WINDOWS_PHONE ||         \
    GTEST_OS_WINDOWS_RT || GTEST_OS_ESP8266 || GTEST_OS_ESP32 || \
    GTEST_OS_XTENSA
  // These platforms do not have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == nullptr ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  char* result = getcwd(cwd, sizeof(cwd));
# if GTEST_OS_NACL
  // getcwd will likely fail in NaCl due to the sandbox, so return something
  // reasonable. The user may have provided a shim implementation for getcwd,
  // however, so fallback only when failure is detected.
  return FilePath(result == nullptr ? kCurrentDirectoryString : cwd);
# endif  // GTEST_OS_NACL
  return FilePath(result == nullptr ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}